

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageRotate(Image *image,int degrees)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  void *pvVar14;
  size_t __size;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  void *local_a0;
  ulong local_98;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (0xd < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    fVar15 = ((float)degrees * 3.1415927) / 180.0;
    fVar16 = sinf(fVar15);
    fVar15 = cosf(fVar15);
    iVar2 = image->width;
    fVar22 = (float)iVar2;
    iVar3 = image->height;
    fVar23 = (float)iVar3;
    uVar13 = (uint)(ABS(fVar16 * fVar23) + ABS(fVar15 * fVar22));
    uVar11 = (uint)(ABS(fVar16 * fVar22) + ABS(fVar15 * fVar23));
    uVar6 = GetPixelDataSize(1,1,image->format);
    __size = (size_t)(int)uVar6;
    pvVar7 = calloc((long)(int)(uVar13 * uVar11),__size);
    if (0 < (int)uVar11) {
      iVar3 = iVar3 + -1;
      local_98 = 0;
      local_a0 = pvVar7;
      do {
        if (0 < (int)uVar13) {
          fVar17 = (float)(int)local_98 - (float)(int)uVar11 * 0.5;
          uVar12 = 0;
          pvVar14 = local_a0;
          do {
            fVar18 = (float)(int)uVar12 - (float)(int)uVar13 * 0.5;
            fVar21 = fVar15 * fVar18 + fVar16 * fVar17 + fVar22 * 0.5;
            if (((0.0 <= fVar21) && (fVar21 < fVar22)) &&
               ((fVar18 = (fVar17 * fVar15 - fVar18 * fVar16) + fVar23 * 0.5, 0.0 <= fVar18 &&
                (fVar18 < fVar23)))) {
              fVar19 = floorf(fVar21);
              fVar20 = floorf(fVar18);
              if (0 < (int)uVar6) {
                iVar9 = (int)fVar19;
                fVar21 = fVar21 - (float)(int)fVar19;
                fVar18 = fVar18 - (float)(int)fVar20;
                iVar1 = (int)fVar20 + 1;
                if (iVar3 <= iVar1) {
                  iVar1 = iVar3;
                }
                iVar5 = iVar9 + 1;
                if (iVar2 + -1 <= iVar9 + 1) {
                  iVar5 = iVar2 + -1;
                }
                pvVar4 = image->data;
                iVar8 = (int)fVar20 * iVar2;
                uVar10 = 0;
                do {
                  *(char *)((long)pvVar14 + uVar10) =
                       (char)(int)((float)*(byte *)((long)pvVar4 +
                                                   uVar10 + (long)(int)((iVar1 * iVar2 + iVar5) *
                                                                       uVar6)) * fVar21 * fVar18 +
                                  (float)*(byte *)((long)pvVar4 +
                                                  uVar10 + (long)(int)((iVar9 + iVar1 * iVar2) *
                                                                      uVar6)) * (1.0 - fVar21) *
                                  fVar18 + (float)*(byte *)((long)pvVar4 +
                                                           uVar10 + (long)(int)((iVar8 + iVar5) *
                                                                               uVar6)) * fVar21 *
                                           (1.0 - fVar18) +
                                           (float)*(byte *)((long)pvVar4 +
                                                           uVar10 + (long)(int)((iVar8 + iVar9) *
                                                                               uVar6)) *
                                           (1.0 - fVar21) * (1.0 - fVar18));
                  uVar10 = uVar10 + 1;
                } while (uVar6 != uVar10);
              }
            }
            uVar12 = uVar12 + 1;
            pvVar14 = (void *)((long)pvVar14 + __size);
          } while (uVar12 != uVar13);
        }
        local_98 = local_98 + 1;
        local_a0 = (void *)((long)local_a0 + (long)(int)uVar13 * __size);
      } while (local_98 != uVar11);
    }
    free(image->data);
    image->data = pvVar7;
    image->width = uVar13;
    image->height = uVar11;
  }
  return;
}

Assistant:

void ImageRotate(Image *image, int degrees)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        float rad = degrees*PI/180.0f;
        float sinRadius = sinf(rad);
        float cosRadius = cosf(rad);

        int width = (int)(fabsf(image->width*cosRadius) + fabsf(image->height*sinRadius));
        int height = (int)(fabsf(image->height*cosRadius) + fabsf(image->width*sinRadius));

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_CALLOC(width*height, bytesPerPixel);

        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                float oldX = ((x - width/2.0f)*cosRadius + (y - height/2.0f)*sinRadius) + image->width/2.0f;
                float oldY = ((y - height/2.0f)*cosRadius - (x - width/2.0f)*sinRadius) + image->height/2.0f;

                if ((oldX >= 0) && (oldX < image->width) && (oldY >= 0) && (oldY < image->height))
                {
                    int x1 = (int)floorf(oldX);
                    int y1 = (int)floorf(oldY);
                    int x2 = MIN(x1 + 1, image->width - 1);
                    int y2 = MIN(y1 + 1, image->height - 1);

                    float px = oldX - x1;
                    float py = oldY - y1;

                    for (int i = 0; i < bytesPerPixel; i++)
                    {
                        float f1 = ((unsigned char *)image->data)[(y1*image->width + x1)*bytesPerPixel + i];
                        float f2 = ((unsigned char *)image->data)[(y1*image->width + x2)*bytesPerPixel + i];
                        float f3 = ((unsigned char *)image->data)[(y2*image->width + x1)*bytesPerPixel + i];
                        float f4 = ((unsigned char *)image->data)[(y2*image->width + x2)*bytesPerPixel + i];

                        float val = f1*(1 - px)*(1 - py) + f2*px*(1 - py) + f3*(1 - px)*py + f4*px*py;

                        rotatedData[(y*width + x)*bytesPerPixel + i] = (unsigned char)val;
                    }
                }
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        image->width = width;
        image->height = height;
    }
}